

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unpack_template.h
# Opt level: O2

int template_execute(template_context *ctx,char *data,size_t len,size_t *off)

{
  size_t *psVar1;
  undefined8 *puVar2;
  undefined2 uVar3;
  long lVar4;
  ulong uVar5;
  undefined8 uVar6;
  uint64_t uVar7;
  ushort uVar8;
  msgpack_object_type mVar9;
  int iVar10;
  undefined1 uVar11;
  double dVar12;
  ulong uVar13;
  uint uVar14;
  msgpack_object *pmVar15;
  int unaff_EBX;
  ulong unaff_RBP;
  uint uVar16;
  uint uVar17;
  uint uVar18;
  msgpack_object **ppmVar19;
  long lVar20;
  msgpack_object_union *pmVar21;
  uint *puVar22;
  ulong uVar23;
  ulong unaff_R12;
  msgpack_object *pmVar24;
  msgpack_object *unaff_R14;
  ulong unaff_R15;
  msgpack_object *local_98;
  uint local_90;
  ulong local_88;
  msgpack_object *local_80;
  ulong local_38;
  
  uVar13 = *off;
  if (len < uVar13) {
    __assert_fail("len >= *off",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/xutiezhu[P]tqapi/lib/msgpack/include/msgpack/unpack_template.h"
                  ,0x5b,
                  "int template_execute(struct template_context *, const char *, size_t, size_t *)")
    ;
  }
  local_98 = (msgpack_object *)(data + uVar13);
  local_90 = ctx->cs;
  local_88 = (ulong)ctx->trail;
  uVar14 = ctx->top;
  uVar23 = (ulong)uVar14;
  if (uVar13 != len) {
    pmVar15 = (msgpack_object *)(data + len);
    local_80 = (msgpack_object *)0x0;
LAB_001636ba:
    uVar14 = (uint)uVar23;
    uVar23 = uVar23 & 0xffffffff;
    pmVar24 = local_98;
    if (local_90 != 0) goto LAB_00163914;
    uVar11 = (undefined1)local_98->type;
    uVar18 = (uint)(byte)uVar11;
    if ((byte)uVar11 - 0x80 < 0x80) {
      uVar16 = (uint)(byte)uVar11;
      switch((uint)(byte)uVar11) {
      case 0x80:
      case 0x81:
      case 0x82:
      case 0x83:
      case 0x84:
      case 0x85:
      case 0x86:
      case 0x87:
      case 0x88:
      case 0x89:
      case 0x8a:
      case 0x8b:
      case 0x8c:
      case 0x8d:
      case 0x8e:
      case 0x8f:
        local_90 = 0;
        if (uVar14 < 0x20) {
          pmVar24 = &ctx->stack[uVar23].obj;
          iVar10 = template_callback_map(&ctx->user,uVar16 & 0xf,pmVar24);
          if (-1 < iVar10) {
            if ((local_98->type & (MSGPACK_OBJECT_BIN|MSGPACK_OBJECT_MAP)) == MSGPACK_OBJECT_NIL) {
LAB_0016382c:
              mVar9 = pmVar24->type;
              unaff_EBX = *(int *)&pmVar24->field_0x4;
              uVar13 = (pmVar24->via).u64;
              unaff_RBP = uVar13 >> 8 & 0xffffff;
              unaff_R15 = uVar13 >> 0x20;
              unaff_R14 = (pmVar24->via).array.ptr;
              local_90 = 0;
LAB_00163efb:
              uVar18 = (uint)uVar13;
              goto LAB_00163f0a;
            }
            pmVar24[1].via.array.size = 1;
            goto LAB_0016380b;
          }
        }
        else {
LAB_00164144:
          local_90 = 0;
          iVar10 = -2;
        }
        break;
      case 0x90:
      case 0x91:
      case 0x92:
      case 0x93:
      case 0x94:
      case 0x95:
      case 0x96:
      case 0x97:
      case 0x98:
      case 0x99:
      case 0x9a:
      case 0x9b:
      case 0x9c:
      case 0x9d:
      case 0x9e:
      case 0x9f:
        local_90 = 0;
        if (0x1f < uVar14) goto LAB_00164144;
        pmVar24 = &ctx->stack[uVar23].obj;
        iVar10 = template_callback_array(&ctx->user,uVar16 & 0xf,pmVar24);
        if (-1 < iVar10) {
          if ((local_98->type & (MSGPACK_OBJECT_BIN|MSGPACK_OBJECT_MAP)) == MSGPACK_OBJECT_NIL)
          goto LAB_0016382c;
          pmVar24[1].via.array.size = 0;
LAB_0016380b:
          local_38 = (ulong)((byte)(char)local_98->type & 0xf);
LAB_00163d06:
          *(ulong *)(pmVar24 + 1) = local_38;
          uVar23 = (ulong)(uVar14 + 1);
          goto LAB_0016408c;
        }
        break;
      default:
        uVar17 = uVar16 & 0x1f;
        if ((uVar11 & 0x1f) != MSGPACK_OBJECT_NIL) {
          uVar18 = 0x20;
          goto LAB_00163904;
        }
        local_90 = 0;
        local_88 = 0;
LAB_00163e58:
        unaff_RBP = local_88 >> 8;
        (ctx->user).referenced = true;
        uVar18 = (uint)local_88;
        mVar9 = MSGPACK_OBJECT_STR;
        unaff_R14 = local_80;
        goto LAB_00163f0a;
      case 0xc0:
      case 0xc1:
      case 0xc2:
      case 0xc3:
      case 0xc4:
      case 0xc5:
      case 0xc6:
      case 199:
      case 200:
      case 0xc9:
      case 0xca:
      case 0xcb:
      case 0xcc:
      case 0xcd:
      case 0xce:
      case 0xcf:
      case 0xd0:
      case 0xd1:
      case 0xd2:
      case 0xd3:
      case 0xd4:
      case 0xd5:
      case 0xd6:
      case 0xd7:
      case 0xd8:
      case 0xd9:
      case 0xda:
      case 0xdb:
      case 0xdc:
      case 0xdd:
      case 0xde:
      case 0xdf:
        local_90 = 0;
        switch(uVar11) {
        case 0xc0:
          uVar18 = (uint)unaff_R12;
          mVar9 = MSGPACK_OBJECT_NIL;
          goto LAB_00163f0a;
        default:
          goto switchD_00163733_caseD_c1;
        case 0xc2:
          uVar18 = 0;
          mVar9 = MSGPACK_OBJECT_BOOLEAN;
          local_90 = 0;
          goto LAB_00163f0a;
        case 0xc3:
          uVar18 = 1;
          mVar9 = MSGPACK_OBJECT_BOOLEAN;
          goto LAB_00163f0a;
        case 0xc4:
        case 0xc5:
        case 0xc6:
          uVar11 = uVar11 & MSGPACK_OBJECT_NEGATIVE_INTEGER;
          iVar10 = 1;
          break;
        case 199:
        case 200:
        case 0xc9:
          uVar11 = uVar11 + MSGPACK_OBJECT_BOOLEAN & MSGPACK_OBJECT_NEGATIVE_INTEGER;
          iVar10 = 1;
          break;
        case 0xca:
        case 0xcb:
        case 0xcc:
        case 0xcd:
        case 0xce:
        case 0xcf:
        case 0xd0:
        case 0xd1:
        case 0xd2:
        case 0xd3:
          uVar11 = uVar11 & MSGPACK_OBJECT_NEGATIVE_INTEGER;
          goto LAB_0016388f;
        case 0xd4:
        case 0xd5:
        case 0xd6:
        case 0xd7:
          uVar17 = (1 << (uVar11 & MSGPACK_OBJECT_NEGATIVE_INTEGER)) + 1;
          uVar18 = 0x22;
          goto LAB_00163904;
        case 0xd8:
          uVar17 = 0x11;
          uVar18 = 0x22;
          goto LAB_00163904;
        case 0xd9:
        case 0xda:
        case 0xdb:
          uVar11 = (uVar11 & MSGPACK_OBJECT_NEGATIVE_INTEGER) - MSGPACK_OBJECT_BOOLEAN;
LAB_0016388f:
          iVar10 = 1;
          break;
        case 0xdc:
        case 0xdd:
        case 0xde:
        case 0xdf:
          uVar11 = uVar11 & MSGPACK_OBJECT_BOOLEAN;
          iVar10 = 2;
        }
        uVar17 = iVar10 << (uVar11 & 0x1f);
        uVar18 = uVar16 & 0x1f;
LAB_00163904:
        local_90 = uVar18;
        local_88 = (ulong)uVar17;
        pmVar24 = (msgpack_object *)((long)&local_98->type + 1);
LAB_00163914:
        local_80 = pmVar24;
        if ((ulong)((long)pmVar15 - (long)local_80) < local_88) {
          iVar10 = 0;
          local_98 = local_80;
          break;
        }
        local_98 = (msgpack_object *)((long)&local_80->type + (ulong)((uint)local_88 - 1));
        uVar18 = 0x21;
        switch(local_90) {
        case 4:
          uVar11 = (undefined1)local_80->type;
          uVar17 = (uint)(byte)uVar11;
          if (uVar11 == MSGPACK_OBJECT_NIL) goto LAB_00163ab6;
          goto LAB_00163904;
        case 5:
          uVar3 = (undefined2)local_80->type;
          uVar17 = (uint)(ushort)(uVar3 << 8 | (ushort)uVar3 >> 8);
          if (uVar3 == MSGPACK_OBJECT_NIL) goto LAB_00163ab6;
          goto LAB_00163904;
        case 6:
          goto switchD_00163952_caseD_6;
        case 7:
          uVar17 = (uint)(byte)(char)local_80->type;
          goto LAB_00163bb2;
        case 8:
          uVar3 = (undefined2)local_80->type;
          uVar17 = (uint)(ushort)(uVar3 << 8 | (ushort)uVar3 >> 8);
LAB_00163bb2:
          uVar17 = uVar17 + 1;
          break;
        case 9:
          mVar9 = local_80->type;
          uVar17 = (mVar9 >> 0x18 | (mVar9 & 0xff0000) >> 8 | (mVar9 & 0xff00) << 8 | mVar9 << 0x18)
                   + 1;
          if (uVar17 == 0) {
            local_90 = 9;
            goto LAB_00164154;
          }
          break;
        case 10:
          mVar9 = local_80->type;
          dVar12 = (double)(float)(mVar9 >> 0x18 | (mVar9 & 0xff0000) >> 8 | (mVar9 & 0xff00) << 8 |
                                  mVar9 << 0x18);
          unaff_RBP = (ulong)dVar12 >> 8 & 0xffffff;
          unaff_R15 = (ulong)dVar12 >> 0x20;
          mVar9 = MSGPACK_OBJECT_FLOAT32;
          local_90 = 10;
          goto LAB_00163c85;
        case 0xb:
          uVar13 = *(ulong *)local_80;
          uVar5 = uVar13 >> 0x38 | (uVar13 & 0xff000000000000) >> 0x28 |
                  (uVar13 & 0xff0000000000) >> 0x18 | (uVar13 & 0xff00000000) >> 8;
          uVar13 = uVar5 | (uVar13 & 0xff000000) << 8 | (uVar13 & 0xff0000) << 0x18 |
                   (uVar13 & 0xff00) << 0x28 | uVar13 << 0x38;
          unaff_RBP = uVar5 >> 8;
          unaff_R15 = uVar13 >> 0x20;
          local_90 = 0xb;
          mVar9 = MSGPACK_OBJECT_FLOAT;
          goto LAB_00163e3d;
        case 0xc:
          uVar13 = (ulong)(byte)(char)local_80->type;
          local_90 = 0xc;
          unaff_RBP = 0;
          goto LAB_00163e38;
        case 0xd:
          uVar3 = (undefined2)local_80->type;
          uVar13 = (ulong)((ushort)uVar3 >> 8);
          unaff_RBP = (ulong)(ushort)(uVar3 & 0xff);
          local_90 = 0xd;
          goto LAB_00163e38;
        case 0xe:
          mVar9 = local_80->type;
          uVar14 = mVar9 >> 0x18 | (mVar9 & 0xff0000) >> 8 | (mVar9 & 0xff00) << 8 | mVar9 << 0x18;
          uVar13 = (ulong)uVar14;
          unaff_RBP = (ulong)(uVar14 >> 8);
          local_90 = 0xe;
LAB_00163e38:
          unaff_R15 = 0;
LAB_00163e3b:
          mVar9 = MSGPACK_OBJECT_POSITIVE_INTEGER;
LAB_00163e3d:
          uVar18 = (uint)uVar13;
          goto LAB_00163f0a;
        case 0xf:
          uVar13 = *(ulong *)local_80;
          uVar5 = uVar13 >> 0x38 | (uVar13 & 0xff000000000000) >> 0x28 |
                  (uVar13 & 0xff0000000000) >> 0x18 | (uVar13 & 0xff00000000) >> 8;
          uVar13 = uVar5 | (uVar13 & 0xff000000) << 8 | (uVar13 & 0xff0000) << 0x18 |
                   (uVar13 & 0xff00) << 0x28 | uVar13 << 0x38;
          unaff_RBP = uVar5 >> 8;
          unaff_R15 = uVar13 >> 0x20;
          local_90 = 0xf;
          goto LAB_00163e3b;
        case 0x10:
          uVar11 = (undefined1)local_80->type;
          dVar12 = (double)(long)(char)uVar11;
          mVar9 = -1 < (long)dVar12 ^ MSGPACK_OBJECT_NEGATIVE_INTEGER;
          unaff_RBP = (ulong)((uint)(int)(char)uVar11 >> 8);
          unaff_R15 = (ulong)dVar12 >> 0x20;
          local_90 = 0x10;
          goto LAB_00163c85;
        case 0x11:
          uVar3 = (undefined2)local_80->type;
          uVar8 = uVar3 << 8 | (ushort)uVar3 >> 8;
          dVar12 = (double)(long)(short)uVar8;
          mVar9 = -1 < (short)uVar8 ^ MSGPACK_OBJECT_NEGATIVE_INTEGER;
          unaff_RBP = (ulong)((uint)(int)(short)uVar8 >> 8);
          unaff_R15 = (ulong)dVar12 >> 0x20;
          local_90 = 0x11;
          goto LAB_00163c85;
        case 0x12:
          mVar9 = local_80->type;
          uVar14 = mVar9 >> 0x18 | (mVar9 & 0xff0000) >> 8 | (mVar9 & 0xff00) << 8 | mVar9 << 0x18;
          dVar12 = (double)(long)(int)uVar14;
          if (-1 < (int)uVar14) {
            dVar12 = (double)(ulong)uVar14;
          }
          mVar9 = -1 < (int)uVar14 ^ MSGPACK_OBJECT_NEGATIVE_INTEGER;
          unaff_RBP = (ulong)dVar12 >> 8 & 0xffffff;
          unaff_R15 = (ulong)dVar12 >> 0x20;
          local_90 = 0x12;
          goto LAB_00163c85;
        case 0x13:
          uVar13 = *(ulong *)local_80;
          uVar5 = uVar13 >> 0x38 | (uVar13 & 0xff000000000000) >> 0x28 |
                  (uVar13 & 0xff0000000000) >> 0x18 | (uVar13 & 0xff00000000) >> 8;
          dVar12 = (double)(uVar5 | (uVar13 & 0xff000000) << 8 | (uVar13 & 0xff0000) << 0x18 |
                            (uVar13 & 0xff00) << 0x28 | uVar13 << 0x38);
          mVar9 = -1 < (long)dVar12 ^ MSGPACK_OBJECT_NEGATIVE_INTEGER;
          unaff_RBP = uVar5 >> 8;
          unaff_R15 = (ulong)dVar12 >> 0x20;
          local_90 = 0x13;
LAB_00163c85:
          uVar18 = SUB84(dVar12,0);
          goto LAB_00163f0a;
        case 0x14:
          uVar17 = 2;
          goto LAB_00163bbe;
        case 0x15:
          uVar17 = 3;
          break;
        case 0x16:
          uVar17 = 5;
          break;
        case 0x17:
          uVar17 = 9;
          break;
        case 0x18:
          uVar17 = 0x11;
LAB_00163bbe:
          uVar18 = 0x22;
          goto LAB_00163904;
        case 0x19:
          uVar11 = (undefined1)local_80->type;
          uVar17 = (uint)(byte)uVar11;
          if (uVar11 == MSGPACK_OBJECT_NIL) {
            local_90 = 0x19;
LAB_00163e4d:
            local_88 = 0;
            goto switchD_00163952_caseD_20;
          }
          goto LAB_00163e16;
        case 0x1a:
          uVar3 = (undefined2)local_80->type;
          uVar17 = (uint)(ushort)(uVar3 << 8 | (ushort)uVar3 >> 8);
          if (uVar3 == MSGPACK_OBJECT_NIL) {
            local_90 = 0x1a;
            goto LAB_00163e4d;
          }
          goto LAB_00163e16;
        case 0x1b:
          mVar9 = local_80->type;
          uVar17 = mVar9 >> 0x18 | (mVar9 & 0xff0000) >> 8 | (mVar9 & 0xff00) << 8 | mVar9 << 0x18;
          if (mVar9 == MSGPACK_OBJECT_NIL) {
            local_90 = 0x1b;
            goto LAB_00163e4d;
          }
LAB_00163e16:
          uVar18 = 0x20;
          goto LAB_00163904;
        case 0x1c:
          local_90 = 0x1c;
          if (0x1f < uVar14) goto LAB_0016413b;
          uVar3 = (undefined2)local_80->type;
          uVar8 = uVar3 << 8 | (ushort)uVar3 >> 8;
          pmVar24 = &ctx->stack[uVar23].obj;
          iVar10 = template_callback_array(&ctx->user,(uint)uVar8,pmVar24);
          if (iVar10 < 0) goto LAB_001640f3;
          if (uVar3 == MSGPACK_OBJECT_NIL) {
            mVar9 = pmVar24->type;
            unaff_EBX = *(int *)&pmVar24->field_0x4;
            uVar13 = (pmVar24->via).u64;
            unaff_RBP = uVar13 >> 8 & 0xffffff;
            unaff_R15 = uVar13 >> 0x20;
            unaff_R14 = (pmVar24->via).array.ptr;
            local_90 = 0x1c;
            goto LAB_00163efb;
          }
          pmVar24[1].via.array.size = 0;
LAB_00163d01:
          local_38 = (ulong)uVar8;
          goto LAB_00163d06;
        case 0x1d:
          local_90 = 0x1d;
          if (0x1f < uVar14) goto LAB_0016413b;
          mVar9 = local_80->type;
          uVar18 = mVar9 >> 0x18 | (mVar9 & 0xff0000) >> 8 | (mVar9 & 0xff00) << 8 | mVar9 << 0x18;
          pmVar24 = &ctx->stack[uVar23].obj;
          iVar10 = template_callback_array(&ctx->user,uVar18,pmVar24);
          if (iVar10 < 0) goto LAB_001640f3;
          if (mVar9 == MSGPACK_OBJECT_NIL) {
            mVar9 = pmVar24->type;
            unaff_EBX = *(int *)&pmVar24->field_0x4;
            uVar13 = (pmVar24->via).u64;
            unaff_RBP = uVar13 >> 8 & 0xffffff;
            unaff_R15 = uVar13 >> 0x20;
            unaff_R14 = (pmVar24->via).array.ptr;
            local_90 = 0x1d;
            goto LAB_00163efb;
          }
          pmVar24[1].via.array.size = 0;
          local_38 = (ulong)uVar18;
          goto LAB_00163d06;
        case 0x1e:
          local_90 = 0x1e;
          if (0x1f < uVar14) goto LAB_0016413b;
          uVar3 = (undefined2)local_80->type;
          uVar8 = uVar3 << 8 | (ushort)uVar3 >> 8;
          pmVar24 = &ctx->stack[uVar23].obj;
          iVar10 = template_callback_map(&ctx->user,(uint)uVar8,pmVar24);
          if (iVar10 < 0) goto LAB_001640f3;
          if (uVar3 != MSGPACK_OBJECT_NIL) {
            pmVar24[1].via.array.size = 1;
            goto LAB_00163d01;
          }
          mVar9 = pmVar24->type;
          unaff_EBX = *(int *)&pmVar24->field_0x4;
          uVar13 = (pmVar24->via).u64;
          unaff_RBP = uVar13 >> 8 & 0xffffff;
          unaff_R15 = uVar13 >> 0x20;
          unaff_R14 = (pmVar24->via).array.ptr;
          local_90 = 0x1e;
          goto LAB_00163efb;
        case 0x1f:
          local_90 = 0x1f;
          if (0x1f < uVar14) {
LAB_0016413b:
            iVar10 = -2;
            goto LAB_001640f3;
          }
          mVar9 = local_80->type;
          uVar18 = mVar9 >> 0x18 | (mVar9 & 0xff0000) >> 8 | (mVar9 & 0xff00) << 8 | mVar9 << 0x18;
          pmVar24 = &ctx->stack[uVar23].obj;
          iVar10 = template_callback_map(&ctx->user,uVar18,pmVar24);
          if (iVar10 < 0) goto LAB_001640f3;
          if (mVar9 != MSGPACK_OBJECT_NIL) {
            pmVar24[1].via.array.size = 1;
            *(ulong *)(pmVar24 + 1) = (ulong)uVar18;
            uVar23 = (ulong)(uVar14 + 1);
            goto LAB_0016408c;
          }
          mVar9 = pmVar24->type;
          unaff_EBX = *(int *)&pmVar24->field_0x4;
          uVar13 = (pmVar24->via).u64;
          unaff_RBP = uVar13 >> 8 & 0xffffff;
          unaff_R15 = uVar13 >> 0x20;
          unaff_R14 = (pmVar24->via).array.ptr;
          local_90 = 0x1f;
          goto LAB_00163efb;
        case 0x20:
switchD_00163952_caseD_20:
          goto LAB_00163e58;
        case 0x21:
          goto switchD_00163952_caseD_21;
        case 0x22:
          if ((uint)local_88 == 0) {
            local_90 = 0x22;
LAB_00164154:
            local_88._0_4_ = 0;
            goto switchD_00163952_default;
          }
          mVar9 = MSGPACK_OBJECT_EXT;
          uVar18 = (uint)(byte)(char)local_80->type;
          (ctx->user).referenced = true;
          local_90 = 0x22;
          unaff_R15 = (ulong)((uint)local_88 - 1);
          unaff_R14 = (msgpack_object *)((long)&local_80->type + 1);
          goto LAB_00163f0a;
        default:
switchD_00163952_default:
          iVar10 = -1;
          goto LAB_001640f3;
        }
        uVar18 = 0x22;
        goto LAB_00163904;
      case 0xe0:
      case 0xe1:
      case 0xe2:
      case 0xe3:
      case 0xe4:
      case 0xe5:
      case 0xe6:
      case 0xe7:
      case 0xe8:
      case 0xe9:
      case 0xea:
      case 0xeb:
      case 0xec:
      case 0xed:
      case 0xee:
      case 0xef:
      case 0xf0:
      case 0xf1:
      case 0xf2:
      case 0xf3:
      case 0xf4:
      case 0xf5:
      case 0xf6:
      case 0xf7:
      case 0xf8:
      case 0xf9:
      case 0xfa:
      case 0xfb:
      case 0xfc:
      case 0xfd:
      case 0xfe:
      case 0xff:
        local_90 = 0;
        unaff_RBP = 0xffffff;
        unaff_R15 = 0xffffffff;
        mVar9 = MSGPACK_OBJECT_NEGATIVE_INTEGER;
        goto LAB_00163f0a;
      }
    }
    else {
      unaff_R15 = 0;
      unaff_RBP = 0;
      mVar9 = MSGPACK_OBJECT_POSITIVE_INTEGER;
      local_90 = 0;
      uVar18 = (uint)(byte)uVar11;
      if (-1 < (char)uVar11) goto LAB_00163f0a;
      local_90 = 0;
switchD_00163733_caseD_c1:
      iVar10 = -1;
    }
    goto LAB_001640f3;
  }
  iVar10 = 0;
  local_88._0_4_ = ctx->trail;
LAB_001640f3:
  ctx->cs = local_90;
  ctx->trail = (uint)local_88;
  ctx->top = uVar14;
  *off = (long)local_98 - (long)data;
  return iVar10;
switchD_00163952_caseD_6:
  mVar9 = local_80->type;
  uVar17 = mVar9 >> 0x18 | (mVar9 & 0xff0000) >> 8 | (mVar9 & 0xff00) << 8 | mVar9 << 0x18;
  if (mVar9 == MSGPACK_OBJECT_NIL) goto LAB_00163ab6;
  goto LAB_00163904;
LAB_00163ab6:
  local_88 = 0;
switchD_00163952_caseD_21:
  unaff_RBP = local_88 >> 8;
  (ctx->user).referenced = true;
  mVar9 = MSGPACK_OBJECT_BIN;
  uVar18 = (uint)local_88;
  unaff_R14 = local_80;
LAB_00163f0a:
  puVar22 = &ctx->stack[uVar23 - 1].ct;
  unaff_R12 = (ulong)uVar18;
  do {
    uVar13 = unaff_R12 & 0xff;
    iVar10 = (int)unaff_RBP;
    if (uVar23 == 0) {
      ctx->stack[0].obj.type = mVar9;
      *(int *)&ctx->stack[0].obj.field_0x4 = unaff_EBX;
      ctx->stack[0].obj.via.u64 = unaff_R15 << 0x20 | uVar13 | (uint)(iVar10 << 8);
      ctx->stack[0].obj.via.array.ptr = unaff_R14;
      local_98 = (msgpack_object *)((long)&local_98->type + 1);
      uVar14 = 0;
      iVar10 = 1;
      goto LAB_001640f3;
    }
    uVar14 = *puVar22;
    if (uVar14 == 0) {
      lVar4 = *(long *)(puVar22 + -4);
      lVar20 = (ulong)(((msgpack_object_union *)(puVar22 + -6))->array).size * 0x18;
      *(msgpack_object_type *)(lVar4 + lVar20) = mVar9;
      *(int *)(lVar4 + 4 + lVar20) = unaff_EBX;
      *(ulong *)(lVar4 + 8 + lVar20) = unaff_R15 << 0x20 | uVar13 | (uint)(iVar10 << 8);
      *(msgpack_object **)(lVar4 + 0x10 + lVar20) = unaff_R14;
      (((msgpack_object_union *)(puVar22 + -6))->array).size =
           (((msgpack_object_union *)(puVar22 + -6))->array).size + 1;
      psVar1 = (size_t *)(puVar22 + -2);
      *psVar1 = *psVar1 - 1;
      if (*psVar1 != 0) {
        uVar23 = uVar23 & 0xffffffff;
        goto LAB_0016408c;
      }
      pmVar21 = &ctx->stack[uVar23 - 1].obj.via;
      ppmVar19 = &ctx->stack[uVar23 - 1].obj.via.array.ptr;
    }
    else {
      if (uVar14 != 2) {
        if (uVar14 == 1) {
          ((msgpack_object *)(puVar22 + 2))->type = mVar9;
          puVar22[3] = unaff_EBX;
          ((msgpack_object_union *)(puVar22 + 4))->u64 =
               unaff_R15 << 0x20 | uVar13 | (uint)(iVar10 << 8);
          *(msgpack_object **)(puVar22 + 6) = unaff_R14;
          *puVar22 = 2;
          uVar23 = uVar23 & 0xffffffff;
          goto LAB_0016408c;
        }
        uVar14 = (uint)uVar23;
        goto switchD_00163733_caseD_c1;
      }
      lVar4 = *(long *)(puVar22 + -4);
      lVar20 = (ulong)(((msgpack_object_union *)(puVar22 + -6))->array).size * 0x30;
      uVar6 = *(undefined8 *)(puVar22 + 2);
      uVar7 = ((msgpack_object_union *)(puVar22 + 4))->u64;
      *(undefined8 *)(lVar4 + 0x10 + lVar20) = *(undefined8 *)(puVar22 + 6);
      puVar2 = (undefined8 *)(lVar4 + lVar20);
      *puVar2 = uVar6;
      puVar2[1] = uVar7;
      lVar4 = *(long *)(puVar22 + -4);
      lVar20 = (ulong)(((msgpack_object_union *)(puVar22 + -6))->array).size * 0x30;
      *(msgpack_object_type *)(lVar4 + 0x18 + lVar20) = mVar9;
      *(int *)(lVar4 + 0x1c + lVar20) = unaff_EBX;
      *(ulong *)(lVar4 + 0x20 + lVar20) = unaff_R15 << 0x20 | uVar13 | (uint)(iVar10 << 8);
      *(msgpack_object **)(lVar4 + 0x28 + lVar20) = unaff_R14;
      (((msgpack_object_union *)(puVar22 + -6))->array).size =
           (((msgpack_object_union *)(puVar22 + -6))->array).size + 1;
      psVar1 = (size_t *)(puVar22 + -2);
      *psVar1 = *psVar1 - 1;
      if (*psVar1 != 0) break;
      pmVar21 = (msgpack_object_union *)(puVar22 + -6);
      ppmVar19 = (msgpack_object **)(puVar22 + -4);
    }
    mVar9 = (((template_stack *)(puVar22 + -8))->obj).type;
    unaff_EBX = puVar22[-7];
    unaff_R14 = *ppmVar19;
    unaff_R12 = pmVar21->u64;
    unaff_R15 = unaff_R12 >> 0x20;
    unaff_RBP = unaff_R12 >> 8 & 0xffffff;
    puVar22 = puVar22 + -0x10;
    uVar23 = uVar23 - 1;
  } while( true );
  *puVar22 = 1;
LAB_0016408c:
  uVar14 = (uint)uVar23;
  local_98 = (msgpack_object *)((long)&local_98->type + 1);
  local_90 = 0;
  if (local_98 == pmVar15) goto code_r0x001640a1;
  goto LAB_001636ba;
code_r0x001640a1:
  local_90 = 0;
  iVar10 = 0;
  local_98 = pmVar15;
  goto LAB_001640f3;
}

Assistant:

msgpack_unpack_func(int, _execute)(msgpack_unpack_struct(_context)* ctx, const char* data, size_t len, size_t* off)
{
    assert(len >= *off);
    {
        const unsigned char* p = (unsigned char*)data + *off;
        const unsigned char* const pe = (unsigned char*)data + len;
        const void* n = NULL;

        unsigned int trail = ctx->trail;
        unsigned int cs = ctx->cs;
        unsigned int top = ctx->top;
        msgpack_unpack_struct(_stack)* stack = ctx->stack;
        /*
        unsigned int stack_size = ctx->stack_size;
        */
        msgpack_unpack_user* user = &ctx->user;

        msgpack_unpack_object obj;
        msgpack_unpack_struct(_stack)* c = NULL;

        int ret;

#define push_simple_value(func) \
        ret = msgpack_unpack_callback(func)(user, &obj); \
        if(ret < 0) { goto _failed; } \
        goto _push
#define push_fixed_value(func, arg) \
        ret = msgpack_unpack_callback(func)(user, arg, &obj); \
        if(ret < 0) { goto _failed; } \
        goto _push
#define push_variable_value(func, base, pos, len) \
        ret = msgpack_unpack_callback(func)(user, \
            (const char*)base, (const char*)pos, len, &obj); \
        if(ret < 0) { goto _failed; } \
        goto _push

#define again_fixed_trail(_cs, trail_len) \
        trail = trail_len; \
        cs = _cs; \
        goto _fixed_trail_again
#define again_fixed_trail_if_zero(_cs, trail_len, ifzero) \
        trail = trail_len; \
        if(trail == 0) { goto ifzero; } \
        cs = _cs; \
        goto _fixed_trail_again

#define start_container(func, count_, ct_) \
        if(top >= MSGPACK_EMBED_STACK_SIZE) { \
            ret = MSGPACK_UNPACK_NOMEM_ERROR; \
            goto _failed; \
        } /* FIXME */ \
        ret = msgpack_unpack_callback(func)(user, count_, &stack[top].obj); \
        if(ret < 0) { goto _failed; } \
        if((count_) == 0) { obj = stack[top].obj; goto _push; } \
        stack[top].ct = ct_; \
        stack[top].count = count_; \
        ++top; \
        goto _header_again

#define NEXT_CS(p) \
        ((unsigned int)*p & 0x1f)

#ifdef USE_CASE_RANGE
#define SWITCH_RANGE_BEGIN     switch(*p) {
#define SWITCH_RANGE(FROM, TO) case FROM ... TO:
#define SWITCH_RANGE_DEFAULT   default:
#define SWITCH_RANGE_END       }
#else
#define SWITCH_RANGE_BEGIN     { if(0) {
#define SWITCH_RANGE(FROM, TO) } else if(FROM <= *p && *p <= TO) {
#define SWITCH_RANGE_DEFAULT   } else {
#define SWITCH_RANGE_END       } }
#endif

        if(p == pe) { goto _out; }
        do {
            switch(cs) {
            case MSGPACK_CS_HEADER:
                SWITCH_RANGE_BEGIN
                SWITCH_RANGE(0x00, 0x7f)  // Positive Fixnum
                    push_fixed_value(_uint8, *(uint8_t*)p);
                SWITCH_RANGE(0xe0, 0xff)  // Negative Fixnum
                    push_fixed_value(_int8, *(int8_t*)p);
                SWITCH_RANGE(0xc0, 0xdf)  // Variable
                    switch(*p) {
                    case 0xc0:  // nil
                        push_simple_value(_nil);
                    //case 0xc1:  // string
                    //  again_terminal_trail(NEXT_CS(p), p+1);
                    case 0xc2:  // false
                        push_simple_value(_false);
                    case 0xc3:  // true
                        push_simple_value(_true);
                    case 0xc4: // bin 8
                    case 0xc5: // bin 16
                    case 0xc6: // bin 32
                        again_fixed_trail(NEXT_CS(p), 1 << (((unsigned int)*p) & 0x03));
                    case 0xc7: // ext 8
                    case 0xc8: // ext 16
                    case 0xc9: // ext 32
                        again_fixed_trail(NEXT_CS(p), 1 << ((((unsigned int)*p) + 1) & 0x03));
                    case 0xca:  // float
                    case 0xcb:  // double
                    case 0xcc:  // unsigned int  8
                    case 0xcd:  // unsigned int 16
                    case 0xce:  // unsigned int 32
                    case 0xcf:  // unsigned int 64
                    case 0xd0:  // signed int  8
                    case 0xd1:  // signed int 16
                    case 0xd2:  // signed int 32
                    case 0xd3:  // signed int 64
                        again_fixed_trail(NEXT_CS(p), 1 << (((unsigned int)*p) & 0x03));
                    case 0xd4:  // fixext 1
                    case 0xd5:  // fixext 2
                    case 0xd6:  // fixext 4
                    case 0xd7:  // fixext 8
                        again_fixed_trail_if_zero(MSGPACK_ACS_EXT_VALUE,
                            (1 << (((unsigned int)*p) & 0x03)) + 1, _ext_zero);
                    case 0xd8:  // fixext 16
                        again_fixed_trail_if_zero(MSGPACK_ACS_EXT_VALUE, 16+1, _ext_zero);

                    case 0xd9:  // str 8
                    case 0xda:  // str 16
                    case 0xdb:  // str 32
                        again_fixed_trail(NEXT_CS(p), 1 << ((((unsigned int)*p) & 0x03) - 1));
                    case 0xdc:  // array 16
                    case 0xdd:  // array 32
                    case 0xde:  // map 16
                    case 0xdf:  // map 32
                        again_fixed_trail(NEXT_CS(p), 2u << (((unsigned int)*p) & 0x01));
                    default:
                        ret = MSGPACK_UNPACK_PARSE_ERROR;
                        goto _failed;
                    }
                SWITCH_RANGE(0xa0, 0xbf)  // FixStr
                    again_fixed_trail_if_zero(MSGPACK_ACS_STR_VALUE, ((unsigned int)*p & 0x1f), _str_zero);
                SWITCH_RANGE(0x90, 0x9f)  // FixArray
                    start_container(_array, ((unsigned int)*p) & 0x0f, MSGPACK_CT_ARRAY_ITEM);
                SWITCH_RANGE(0x80, 0x8f)  // FixMap
                    start_container(_map, ((unsigned int)*p) & 0x0f, MSGPACK_CT_MAP_KEY);

                SWITCH_RANGE_DEFAULT
                    ret = MSGPACK_UNPACK_PARSE_ERROR;
                    goto _failed;
                SWITCH_RANGE_END
                // end MSGPACK_CS_HEADER


            _fixed_trail_again:
                ++p;

            default:
                if((size_t)(pe - p) < trail) { goto _out; }
                n = p;  p += trail - 1;
                switch(cs) {
                //case MSGPACK_CS_
                //case MSGPACK_CS_
                case MSGPACK_CS_FLOAT: {
                        union { uint32_t i; float f; } mem;
                        _msgpack_load32(uint32_t, n, &mem.i);
                        push_fixed_value(_float, mem.f); }
                case MSGPACK_CS_DOUBLE: {
                        union { uint64_t i; double f; } mem;
                        _msgpack_load64(uint64_t, n, &mem.i);
#if defined(TARGET_OS_IPHONE)
                    // ok
#elif defined(__arm__) && !(__ARM_EABI__) // arm-oabi
                        // https://github.com/msgpack/msgpack-perl/pull/1
                        mem.i = (mem.i & 0xFFFFFFFFUL) << 32UL | (mem.i >> 32UL);
#endif
                        push_fixed_value(_double, mem.f); }
                case MSGPACK_CS_UINT_8:
                    push_fixed_value(_uint8, *(uint8_t*)n);
                case MSGPACK_CS_UINT_16:{
                    uint16_t tmp;
                    _msgpack_load16(uint16_t,n,&tmp);
                    push_fixed_value(_uint16, tmp);
                }
                case MSGPACK_CS_UINT_32:{
                    uint32_t tmp;
                    _msgpack_load32(uint32_t,n,&tmp);
                    push_fixed_value(_uint32, tmp);
                }
                case MSGPACK_CS_UINT_64:{
                    uint64_t tmp;
                    _msgpack_load64(uint64_t,n,&tmp);
                    push_fixed_value(_uint64, tmp);
                }
                case MSGPACK_CS_INT_8:
                    push_fixed_value(_int8, *(int8_t*)n);
                case MSGPACK_CS_INT_16:{
                    int16_t tmp;
                    _msgpack_load16(int16_t,n,&tmp);
                    push_fixed_value(_int16, tmp);
                }
                case MSGPACK_CS_INT_32:{
                    int32_t tmp;
                    _msgpack_load32(int32_t,n,&tmp);
                    push_fixed_value(_int32, tmp);
                }
                case MSGPACK_CS_INT_64:{
                    int64_t tmp;
                    _msgpack_load64(int64_t,n,&tmp);
                    push_fixed_value(_int64, tmp);
                }
                case MSGPACK_CS_FIXEXT_1:
                    again_fixed_trail_if_zero(MSGPACK_ACS_EXT_VALUE, 1+1, _ext_zero);
                case MSGPACK_CS_FIXEXT_2:
                    again_fixed_trail_if_zero(MSGPACK_ACS_EXT_VALUE, 2+1, _ext_zero);
                case MSGPACK_CS_FIXEXT_4:
                    again_fixed_trail_if_zero(MSGPACK_ACS_EXT_VALUE, 4+1, _ext_zero);
                case MSGPACK_CS_FIXEXT_8:
                    again_fixed_trail_if_zero(MSGPACK_ACS_EXT_VALUE, 8+1, _ext_zero);
                case MSGPACK_CS_FIXEXT_16:
                    again_fixed_trail_if_zero(MSGPACK_ACS_EXT_VALUE, 16+1, _ext_zero);
                case MSGPACK_CS_STR_8:
                    again_fixed_trail_if_zero(MSGPACK_ACS_STR_VALUE, *(uint8_t*)n, _str_zero);
                case MSGPACK_CS_BIN_8:
                    again_fixed_trail_if_zero(MSGPACK_ACS_BIN_VALUE, *(uint8_t*)n, _bin_zero);
                case MSGPACK_CS_EXT_8:
                    again_fixed_trail_if_zero(MSGPACK_ACS_EXT_VALUE, (*(uint8_t*)n) + 1, _ext_zero);
                case MSGPACK_CS_STR_16:{
                    uint16_t tmp;
                    _msgpack_load16(uint16_t,n,&tmp);
                    again_fixed_trail_if_zero(MSGPACK_ACS_STR_VALUE, tmp, _str_zero);
                }
                case MSGPACK_CS_BIN_16:{
                    uint16_t tmp;
                    _msgpack_load16(uint16_t,n,&tmp);
                    again_fixed_trail_if_zero(MSGPACK_ACS_BIN_VALUE, tmp, _bin_zero);
                }
                case MSGPACK_CS_EXT_16:{
                    uint16_t tmp;
                    _msgpack_load16(uint16_t,n,&tmp);
                    again_fixed_trail_if_zero(MSGPACK_ACS_EXT_VALUE, tmp + 1, _ext_zero);
                }
                case MSGPACK_CS_STR_32:{
                    uint32_t tmp;
                    _msgpack_load32(uint32_t,n,&tmp);
                    again_fixed_trail_if_zero(MSGPACK_ACS_STR_VALUE, tmp, _str_zero);
                }
                case MSGPACK_CS_BIN_32:{
                    uint32_t tmp;
                    _msgpack_load32(uint32_t,n,&tmp);
                    again_fixed_trail_if_zero(MSGPACK_ACS_BIN_VALUE, tmp, _bin_zero);
                }
                case MSGPACK_CS_EXT_32:{
                    uint32_t tmp;
                    _msgpack_load32(uint32_t,n,&tmp);
                    again_fixed_trail_if_zero(MSGPACK_ACS_EXT_VALUE, tmp + 1, _ext_zero);
                }
                case MSGPACK_ACS_STR_VALUE:
                _str_zero:
                    push_variable_value(_str, data, n, trail);
                case MSGPACK_ACS_BIN_VALUE:
                _bin_zero:
                    push_variable_value(_bin, data, n, trail);
                case MSGPACK_ACS_EXT_VALUE:
                _ext_zero:
                    push_variable_value(_ext, data, n, trail);

                case MSGPACK_CS_ARRAY_16:{
                    uint16_t tmp;
                    _msgpack_load16(uint16_t,n,&tmp);
                    start_container(_array, tmp, MSGPACK_CT_ARRAY_ITEM);
                }
                case MSGPACK_CS_ARRAY_32:{
                    /* FIXME security guard */
                    uint32_t tmp;
                    _msgpack_load32(uint32_t,n,&tmp);
                    start_container(_array, tmp, MSGPACK_CT_ARRAY_ITEM);
                }

                case MSGPACK_CS_MAP_16:{
                    uint16_t tmp;
                    _msgpack_load16(uint16_t,n,&tmp);
                    start_container(_map, tmp, MSGPACK_CT_MAP_KEY);
                }
                case MSGPACK_CS_MAP_32:{
                    /* FIXME security guard */
                    uint32_t tmp;
                    _msgpack_load32(uint32_t,n,&tmp);
                    start_container(_map, tmp, MSGPACK_CT_MAP_KEY);
                }

                default:
                    ret = MSGPACK_UNPACK_PARSE_ERROR;
                    goto _failed;
                }
            }

    _push:
        if(top == 0) { goto _finish; }
        c = &stack[top-1];
        switch(c->ct) {
        case MSGPACK_CT_ARRAY_ITEM:
            ret = msgpack_unpack_callback(_array_item)(user, &c->obj, obj); \
            if(ret < 0) { goto _failed; }
            if(--c->count == 0) {
                obj = c->obj;
                --top;
                /*printf("stack pop %d\n", top);*/
                goto _push;
            }
            goto _header_again;
        case MSGPACK_CT_MAP_KEY:
            c->map_key = obj;
            c->ct = MSGPACK_CT_MAP_VALUE;
            goto _header_again;
        case MSGPACK_CT_MAP_VALUE:
            ret = msgpack_unpack_callback(_map_item)(user, &c->obj, c->map_key, obj); \
            if(ret < 0) { goto _failed; }
            if(--c->count == 0) {
                obj = c->obj;
                --top;
                /*printf("stack pop %d\n", top);*/
                goto _push;
            }
            c->ct = MSGPACK_CT_MAP_KEY;
            goto _header_again;

        default:
            ret = MSGPACK_UNPACK_PARSE_ERROR;
            goto _failed;
        }

    _header_again:
            cs = MSGPACK_CS_HEADER;
            ++p;
        } while(p != pe);
        goto _out;


    _finish:
        stack[0].obj = obj;
        ++p;
        ret = 1;
        /*printf("-- finish --\n"); */
        goto _end;

    _failed:
        /*printf("** FAILED **\n"); */
        goto _end;

    _out:
        ret = 0;
        goto _end;

    _end:
        ctx->cs = cs;
        ctx->trail = trail;
        ctx->top = top;
        *off = (size_t)(p - (const unsigned char*)data);

        return ret;
    }
}